

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O0

MillerRabin * miller_rabin_new(mp_int *p)

{
  uint uVar1;
  MillerRabin *pMVar2;
  mp_int *pmVar3;
  size_t maxbits;
  MontyContext *pMVar4;
  MillerRabin *mr;
  mp_int *p_local;
  
  pMVar2 = (MillerRabin *)safemalloc(1,0x28,0);
  uVar1 = mp_hs_integer(p,2);
  if (uVar1 == 0) {
    __assert_fail("mp_hs_integer(p, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/millerrabin.c"
                  ,0x6a,"MillerRabin *miller_rabin_new(mp_int *)");
  }
  uVar1 = mp_get_bit(p,0);
  if (uVar1 == 1) {
    pmVar3 = mp_copy(p);
    pMVar2->pm1 = pmVar3;
    mp_sub_integer_into(pMVar2->pm1,pMVar2->pm1,1);
    maxbits = mp_max_bits(pMVar2->pm1);
    pmVar3 = mp_new(maxbits);
    pMVar2->lowbit = pmVar3;
    mp_sub_into(pMVar2->lowbit,pMVar2->lowbit,pMVar2->pm1);
    mp_and_into(pMVar2->lowbit,pMVar2->lowbit,pMVar2->pm1);
    pmVar3 = mp_from_integer(2);
    pMVar2->two = pmVar3;
    pMVar4 = monty_new(p);
    pMVar2->mc = pMVar4;
    pmVar3 = monty_import(pMVar2->mc,pMVar2->pm1);
    pMVar2->m_pm1 = pmVar3;
    return pMVar2;
  }
  __assert_fail("mp_get_bit(p, 0) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/millerrabin.c"
                ,0x6b,"MillerRabin *miller_rabin_new(mp_int *)");
}

Assistant:

MillerRabin *miller_rabin_new(mp_int *p)
{
    MillerRabin *mr = snew(MillerRabin);

    assert(mp_hs_integer(p, 2));
    assert(mp_get_bit(p, 0) == 1);

    mr->pm1 = mp_copy(p);
    mp_sub_integer_into(mr->pm1, mr->pm1, 1);

    /*
     * Standard bit-twiddling trick for isolating the lowest set bit
     * of a number: x & (-x)
     */
    mr->lowbit = mp_new(mp_max_bits(mr->pm1));
    mp_sub_into(mr->lowbit, mr->lowbit, mr->pm1);
    mp_and_into(mr->lowbit, mr->lowbit, mr->pm1);

    mr->two = mp_from_integer(2);

    mr->mc = monty_new(p);
    mr->m_pm1 = monty_import(mr->mc, mr->pm1);

    return mr;
}